

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_chain_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  llama_sampler_context_t pvVar1;
  undefined8 *puVar2;
  code *pcVar3;
  undefined8 *puVar4;
  time_meas tm;
  time_meas tStack_28;
  
  pvVar1 = smpl->ctx;
  time_meas::time_meas(&tStack_28,(int64_t *)((long)pvVar1 + 0x20),*pvVar1);
  puVar4 = *(undefined8 **)((long)pvVar1 + 8);
  puVar2 = *(undefined8 **)((long)pvVar1 + 0x10);
  while( true ) {
    if (puVar4 == puVar2) {
      time_meas::~time_meas(&tStack_28);
      return;
    }
    pcVar3 = *(code **)(*(long *)*puVar4 + 0x10);
    if (pcVar3 == (code *)0x0) break;
    (*pcVar3)((long *)*puVar4,cur_p);
    puVar4 = puVar4 + 1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
             ,0x155,"GGML_ASSERT(%s) failed","smpl->iface->apply");
}

Assistant:

static void llama_sampler_chain_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * chain = (llama_sampler_chain *) smpl->ctx;

    time_meas tm(chain->t_sample_us, chain->params.no_perf);

    for (auto * smpl : chain->samplers) {
        llama_sampler_apply(smpl, cur_p);
    }
}